

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

void __thiscall
Js::FunctionExecutionStateMachine::TransitionToSimpleJitExecutionMode
          (FunctionExecutionStateMachine *this)

{
  CommitExecutedIterations(this);
  this->interpreterLimit = 0;
  this->autoProfilingInterpreter0Limit = 0;
  this->profilingInterpreter0Limit = 0;
  this->autoProfilingInterpreter1Limit = 0;
  this->fullJitThreshold = this->profilingInterpreter1Limit + this->simpleJitLimit;
  VerifyExecutionModeLimits(this);
  VerifyExecutionMode(this,SimpleJit);
  this->executionState = SimpleJit;
  return;
}

Assistant:

void FunctionExecutionStateMachine::TransitionToSimpleJitExecutionMode()
    {
        CommitExecutedIterations();

        interpreterLimit = 0;
        autoProfilingInterpreter0Limit = 0;
        profilingInterpreter0Limit = 0;
        autoProfilingInterpreter1Limit = 0;
        fullJitThreshold = simpleJitLimit + profilingInterpreter1Limit;

        VerifyExecutionModeLimits();
        SetExecutionState(ExecutionState::SimpleJit);
    }